

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O0

int CMtrace_init(CManager cm,CMTraceType trace_type)

{
  char *pcVar1;
  FILE *pFVar2;
  uint in_ESI;
  long in_RDI;
  char name [40];
  int j;
  char *str;
  int trace;
  int i;
  char acStack_58 [52];
  int local_24;
  char *local_20;
  uint local_14;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_14 = 0;
  CMtrace_val[0] = 0;
  CMtrace_val[0xb] = 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  pcVar1 = getenv("CMControlVerbose");
  CMtrace_val[1] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMConnectionVerbose");
  CMtrace_val[2] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMDataVerbose");
  CMtrace_val[4] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTransportVerbose");
  CMtrace_val[5] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMFormatVerbose");
  CMtrace_val[6] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMFreeVerbose");
  CMtrace_val[7] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMAttrVerbose");
  CMtrace_val[8] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMBufferVerbose");
  CMtrace_val[9] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("EVerbose");
  CMtrace_val[10] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMSelectVerbose");
  CMtrace_val[0xc] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("EVdfgVerbose");
  CMtrace_val[0xd] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTraceTiming");
  CMtrace_timing = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTracePID");
  CMtrace_PID = (int)(pcVar1 != (char *)0x0);
  local_20 = getenv("EVWarning");
  if (local_20 != (char *)0x0) {
    __isoc99_sscanf(local_20,"%d",0x19a32c);
  }
  pcVar1 = getenv("CMVerbose");
  if (pcVar1 != (char *)0x0) {
    for (local_24 = 0; local_24 < 0xe; local_24 = local_24 + 1) {
      CMtrace_val[local_24] = 1;
    }
  }
  pcVar1 = getenv("CMLowLevelVerbose");
  CMtrace_val[3] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTraceFile");
  if (pcVar1 != (char *)0x0) {
    CMTrace_file_num = getpid();
  }
  if (CMTrace_file_num == -1) {
    *(undefined8 *)(local_8 + 0x120) = _stdout;
  }
  else {
    if (CMtrace_init::cm_count == 0) {
      sprintf(acStack_58,"CMTrace_output.%d",(ulong)(uint)CMTrace_file_num);
    }
    else {
      sprintf(acStack_58,"CMTrace_output.%d_%d",(ulong)(uint)CMTrace_file_num,
              (ulong)(uint)CMtrace_init::cm_count);
    }
    CMtrace_init::cm_count = CMtrace_init::cm_count + 1;
    pFVar2 = fopen(acStack_58,"w");
    *(FILE **)(local_8 + 0x120) = pFVar2;
    if (*(long *)(local_8 + 0x120) == 0) {
      printf("Failed to open trace file %s\n",acStack_58);
      *(undefined8 *)(local_8 + 0x120) = _stdout;
    }
    else {
      fprintf(*(FILE **)(local_8 + 0x120),"Trace flags set : \n");
      if (CMtrace_val[0] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMAlwaysTrace, ");
      }
      if (CMtrace_val[1] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMControlVerbose, ");
      }
      if (CMtrace_val[2] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMConnectionVerbose, ");
      }
      if (CMtrace_val[3] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMLowLevelVerbose, ");
      }
      if (CMtrace_val[4] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMDataVerbose, ");
      }
      if (CMtrace_val[5] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMTransportVerbose, ");
      }
      if (CMtrace_val[6] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMFormatVerbose, ");
      }
      if (CMtrace_val[7] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMFreeVerbose, ");
      }
      if (CMtrace_val[8] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMAttrVerbose, ");
      }
      if (CMtrace_val[9] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMBufferVerbose, ");
      }
      if (CMtrace_val[10] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"EVerbose, ");
      }
      if (CMtrace_val[0xb] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"EVWarning, ");
      }
      if (CMtrace_val[0xc] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"CMSelectVerbose, ");
      }
      if (CMtrace_val[0xd] != 0) {
        fprintf(*(FILE **)(local_8 + 0x120),"EVdfgVerbose, ");
      }
      fprintf(*(FILE **)(local_8 + 0x120),"\n");
    }
  }
  for (local_10 = 0; local_10 < 0xe; local_10 = local_10 + 1) {
    if (local_10 != 0xb) {
      local_14 = CMtrace_val[(int)local_10] | local_14;
    }
  }
  if (CMtrace_val[5] != 0) {
    CMset_dlopen_verbose(1);
  }
  if (local_14 != 0) {
    EVfprint_version((FILE *)0x12ba0f);
  }
  fflush(*(FILE **)(local_8 + 0x120));
  return CMtrace_val[local_c];
}

Assistant:

extern int CMtrace_init(CManager cm, CMTraceType trace_type)
{
    int i, trace = 0;
    char *str;
    CMtrace_val[0] = 0;
    CMtrace_val[EVWarning] = 1;  /* default on */
    CMtrace_val[CMControlVerbose] = (getenv("CMControlVerbose") != NULL);
    CMtrace_val[CMConnectionVerbose] = (getenv("CMConnectionVerbose") != NULL);
    CMtrace_val[CMDataVerbose] = (getenv("CMDataVerbose") != NULL);
    CMtrace_val[CMTransportVerbose] = (getenv("CMTransportVerbose") != NULL);
    CMtrace_val[CMFormatVerbose] = (getenv("CMFormatVerbose") != NULL);
    CMtrace_val[CMFreeVerbose] = (getenv("CMFreeVerbose") != NULL);
    CMtrace_val[CMAttrVerbose] = (getenv("CMAttrVerbose") != NULL);
    CMtrace_val[CMBufferVerbose] = (getenv("CMBufferVerbose") != NULL);
    CMtrace_val[EVerbose] = (getenv("EVerbose") != NULL);
    CMtrace_val[CMSelectVerbose] = (getenv("CMSelectVerbose") != NULL);    
    CMtrace_val[EVdfgVerbose] = (getenv("EVdfgVerbose") != NULL);
    CMtrace_timing = (getenv("CMTraceTiming") != NULL);
    CMtrace_PID = (getenv("CMTracePID") != NULL);
    if ((str = getenv("EVWarning")) != NULL) {
	sscanf(str, "%d", &CMtrace_val[EVWarning]);
    }
    if (getenv("CMVerbose") != NULL) {
	int j;
	for (j=0; j<CMLastTraceType; j++)
	    CMtrace_val[j] = 1;
    }
    /* for low level verbose, value overrides general CMVerbose */
    CMtrace_val[CMLowLevelVerbose] = (getenv("CMLowLevelVerbose") != NULL);

    if (getenv("CMTraceFile") != NULL) {
	CMTrace_file_num = getpid();
    }
    if (CMTrace_file_num != -1) {
	char name[40];
	static int cm_count = 0;
	if (cm_count == 0) {
	    sprintf(name, "CMTrace_output.%d", (int)CMTrace_file_num);
	} else {
	    sprintf(name, "CMTrace_output.%d_%d", (int)CMTrace_file_num, cm_count);
	}
	cm_count++;
	cm->CMTrace_file = fopen(name, "w");
	if (cm->CMTrace_file == NULL) {
	    printf("Failed to open trace file %s\n", name);
	    cm->CMTrace_file = stdout;
	} else {
	    fprintf(cm->CMTrace_file, "Trace flags set : \n");
	    if (CMtrace_val[CMAlwaysTrace]) fprintf(cm->CMTrace_file, "CMAlwaysTrace, ");
	    if (CMtrace_val[CMControlVerbose]) fprintf(cm->CMTrace_file, "CMControlVerbose, ");
	    if (CMtrace_val[CMConnectionVerbose]) fprintf(cm->CMTrace_file, "CMConnectionVerbose, ");
	    if (CMtrace_val[CMLowLevelVerbose]) fprintf(cm->CMTrace_file, "CMLowLevelVerbose, ");
	    if (CMtrace_val[CMDataVerbose]) fprintf(cm->CMTrace_file, "CMDataVerbose, ");
	    if (CMtrace_val[CMTransportVerbose]) fprintf(cm->CMTrace_file, "CMTransportVerbose, ");
	    if (CMtrace_val[CMFormatVerbose]) fprintf(cm->CMTrace_file, "CMFormatVerbose, ");
	    if (CMtrace_val[CMFreeVerbose]) fprintf(cm->CMTrace_file, "CMFreeVerbose, ");
	    if (CMtrace_val[CMAttrVerbose]) fprintf(cm->CMTrace_file, "CMAttrVerbose, ");
	    if (CMtrace_val[CMBufferVerbose]) fprintf(cm->CMTrace_file, "CMBufferVerbose, ");
	    if (CMtrace_val[EVerbose]) fprintf(cm->CMTrace_file, "EVerbose, ");
	    if (CMtrace_val[EVWarning]) fprintf(cm->CMTrace_file, "EVWarning, ");
	    if (CMtrace_val[CMSelectVerbose]) fprintf(cm->CMTrace_file, "CMSelectVerbose, ");
	    if (CMtrace_val[EVdfgVerbose]) fprintf(cm->CMTrace_file, "EVdfgVerbose, ");
	    fprintf(cm->CMTrace_file, "\n");
	}
    } else {
	cm->CMTrace_file = stdout;
    }
    for (i = 0; i < sizeof(CMtrace_val)/sizeof(CMtrace_val[0]); i++) {
	if (i!=EVWarning) trace |= CMtrace_val[i];
    }
    if (CMtrace_val[CMTransportVerbose]) {
	CMset_dlopen_verbose(1);
    }

    if (trace != 0) {
	EVfprint_version(cm->CMTrace_file);
    }
    fflush(cm->CMTrace_file);
    return CMtrace_val[trace_type];
}